

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void * __thiscall
anon_unknown.dwarf_2f151d::BumpPointerAllocator::allocate(BumpPointerAllocator *this,size_t N)

{
  ulong NBytes;
  void *pvVar1;
  size_t N_local;
  BumpPointerAllocator *this_local;
  
  NBytes = N + 0xf & 0xfffffff0;
  if (0xfef < NBytes + this->BlockList->Current) {
    if (0xff0 < NBytes) {
      pvVar1 = allocateMassive(this,NBytes);
      return pvVar1;
    }
    grow(this);
  }
  this->BlockList->Current = NBytes + this->BlockList->Current;
  return (void *)((long)this->BlockList + ((this->BlockList->Current + 0x10) - NBytes));
}

Assistant:

void* allocate(size_t N) {
    N = (N + 15u) & ~15u;
    if (N + BlockList->Current >= UsableAllocSize) {
      if (N > UsableAllocSize)
        return allocateMassive(N);
      grow();
    }
    BlockList->Current += N;
    return static_cast<void*>(reinterpret_cast<char*>(BlockList + 1) +
                              BlockList->Current - N);
  }